

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O0

String * axl::io::getFullFilePath(StringRef *fileName)

{
  C *__name;
  char *length;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  char *p;
  char fullPath [4096];
  char *in_stack_ffffffffffffefc8;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *result;
  C *in_stack_ffffffffffffefe8;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffeff0;
  
  result = in_RDI;
  __name = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(in_RDI);
  length = realpath(__name,&stack0xffffffffffffefe8);
  err::complete<char*>((char *)result,in_stack_ffffffffffffefc8);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            (in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8,(size_t)length);
  return (String *)in_RDI;
}

Assistant:

sl::String
getFullFilePath(const sl::StringRef& fileName) {
#if (_AXL_OS_WIN)
	char buffer[256];
	sl::String_w fileName_w(rc::BufKind_Stack, buffer, sizeof(buffer));
	fileName_w = fileName;

	size_t bufferLength = ::GetFullPathNameW(fileName_w, 0, NULL, NULL);
	if (!bufferLength)
		return err::failWithLastSystemError(NULL);

	sl::String_w filePath;

	for (;;) {
		wchar_t* p = filePath.createBuffer(bufferLength);
		if (!p)
			return NULL;

		size_t actualLength = ::GetFullPathNameW(fileName_w, bufferLength, p, NULL);
		ASSERT(actualLength != bufferLength); // on success, it should be bufferLength - 1

		if (!actualLength)
			return err::failWithLastSystemError(NULL);

		if (actualLength <= bufferLength)
			return sl::String(filePath, actualLength);

		bufferLength = actualLength; // try again with a bigger buffer
	}

#elif (_AXL_OS_POSIX)
	char fullPath[PATH_MAX];
	char* p = ::realpath(fileName.sz(), fullPath);
	return err::complete<char*>(p, NULL);
#endif
}